

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O3

void __thiscall duckdb::BaseStatistics::BaseStatistics(BaseStatistics *this,BaseStatistics *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> __p_00;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> __p_01;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer __p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ExtraTypeInfo *__tmp;
  element_type *peVar8;
  LogicalType local_48;
  
  LogicalType::LogicalType(&this->type);
  (this->child_stats).
  super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl = (BaseStatistics *)0x0;
  LogicalType::LogicalType(&local_48,&this->type);
  (this->type).id_ = (other->type).id_;
  (this->type).physical_type_ = (other->type).physical_type_;
  peVar8 = (this->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = (this->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (other->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (other->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (other->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (other->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (other->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8;
  p_Var1 = (other->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (other->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var7;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    peVar8 = (other->type).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var7 = (other->type).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  (other->type).id_ = local_48.id_;
  (other->type).physical_type_ = local_48.physical_type_;
  (other->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (other->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar8;
  local_48.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var7;
  LogicalType::~LogicalType(&local_48);
  this->has_null = other->has_null;
  this->has_no_null = other->has_no_null;
  this->distinct_count = other->distinct_count;
  uVar4 = *(undefined8 *)((long)&other->stats_union + 8);
  uVar5 = *(undefined8 *)((long)&other->stats_union + 0x10);
  uVar6 = *(undefined8 *)((long)&other->stats_union + 0x18);
  *(undefined8 *)(this->stats_union).string_data.min =
       *(undefined8 *)(other->stats_union).string_data.min;
  *(undefined8 *)((long)&this->stats_union + 8) = uVar4;
  *(undefined8 *)((long)&this->stats_union + 0x10) = uVar5;
  *(undefined8 *)((long)&this->stats_union + 0x18) = uVar6;
  *(undefined8 *)((long)&this->stats_union + 0x20) =
       *(undefined8 *)((long)&other->stats_union + 0x20);
  __p_00._M_head_impl =
       (this->child_stats).
       super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  (this->child_stats).
  super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl = (BaseStatistics *)0x0;
  __p_01._M_head_impl =
       (other->child_stats).
       super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  (other->child_stats).
  super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl = (BaseStatistics *)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_> *)
        &this->child_stats,__p_01._M_head_impl);
  local_48.id_ = INVALID;
  local_48.physical_type_ = ~INVALID;
  local_48._2_6_ = 0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_> *)
        &other->child_stats,__p_00._M_head_impl);
  ::std::unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
               *)&local_48);
  return;
}

Assistant:

BaseStatistics::BaseStatistics(BaseStatistics &&other) noexcept {
	std::swap(type, other.type);
	has_null = other.has_null;
	has_no_null = other.has_no_null;
	distinct_count = other.distinct_count;
	stats_union = other.stats_union;
	std::swap(child_stats, other.child_stats);
}